

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86_fma.cpp
# Opt level: O1

void __thiscall ncnn::LayerNorm_x86_fma::forward_inplace(LayerNorm_x86_fma *this)

{
  Option *in_RDX;
  Mat *in_RSI;
  
  forward_inplace((LayerNorm_x86_fma *)
                  ((long)&this->_vptr_LayerNorm_x86_fma + (long)this->_vptr_LayerNorm_x86_fma[-0xb])
                  ,in_RSI,in_RDX);
  return;
}

Assistant:

int LayerNorm_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;

    const float* gamma = gamma_data;
    const float* beta = beta_data;

    if (dims == 1)
    {
        int elemcount = w * elempack;
        float* ptr = bottom_top_blob;
        // 1D layer norm is special. Treat them as unpacked.
        fast_1d_layer_norm(ptr, 1, elemcount, elemcount, gamma, beta, affine, eps);
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; ++i)
        {
            float* ptr = bottom_top_blob.row(i);
            fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
        }
    }

    if (dims == 3)
    {
        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                for (int i = 0; i < h; ++i)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);
                    fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
                }
            }
        }
        else // if (affine_size == w * h)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                float* ptr = bottom_top_blob.channel(q);
                fast_1d_layer_norm(ptr, elempack, w * h, w * h * elempack, gamma, beta, affine, eps);
            }
        }
    }

    return 0;
}